

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::ReadableDirectory::Entry>::setCapacity
          (Vector<kj::ReadableDirectory::Entry> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::ReadableDirectory::Entry> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::ReadableDirectory::Entry> newBuilder;
  size_t newSize_local;
  Vector<kj::ReadableDirectory::Entry> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::ReadableDirectory::Entry>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::ReadableDirectory::Entry>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::ReadableDirectory::Entry>
            ((ArrayBuilder<kj::ReadableDirectory::Entry> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::ReadableDirectory::Entry>>(&this->builder);
  ArrayBuilder<kj::ReadableDirectory::Entry>::addAll<kj::ArrayBuilder<kj::ReadableDirectory::Entry>>
            ((ArrayBuilder<kj::ReadableDirectory::Entry> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::ReadableDirectory::Entry>>
                     ((ArrayBuilder<kj::ReadableDirectory::Entry> *)local_38);
  ArrayBuilder<kj::ReadableDirectory::Entry>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::ReadableDirectory::Entry>::~ArrayBuilder
            ((ArrayBuilder<kj::ReadableDirectory::Entry> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }